

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::CheckOutSourceDir(cmCTestScriptHandler *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  int retVal;
  string output;
  char *local_1d8 [4];
  string command;
  ostringstream cmCTestLog_msg;
  
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  iVar3 = 0;
  command.field_2._M_local_buf[0] = '\0';
  output.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::FileExists(&this->SourceDir);
  if ((!bVar1) && ((this->CVSCheckOut)._M_string_length != 0)) {
    output._M_string_length = 0;
    *output._M_dataplus._M_p = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Run cvs: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->CVSCheckOut);
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x241,local_1d8[0],false);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar1 = cmSystemTools::RunSingleCommand
                      (&this->CVSCheckOut,&output,&output,&retVal,(this->CTestRoot)._M_dataplus._M_p
                       ,(this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0);
    iVar3 = 0;
    if (!bVar1 || retVal != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,"Unable to perform cvs checkout:\n",&output);
      cmSystemTools::Error((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      iVar3 = 6;
    }
  }
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&command);
  return iVar3;
}

Assistant:

int cmCTestScriptHandler::CheckOutSourceDir()
{
  std::string command;
  std::string output;
  int retVal;
  bool res;

  if (!cmSystemTools::FileExists(this->SourceDir) &&
      !this->CVSCheckOut.empty()) {
    // we must now checkout the src dir
    output.clear();
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run cvs: " << this->CVSCheckOut << std::endl);
    res = cmSystemTools::RunSingleCommand(
      this->CVSCheckOut, &output, &output, &retVal, this->CTestRoot.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);
    if (!res || retVal != 0) {
      cmSystemTools::Error("Unable to perform cvs checkout:\n" + output);
      return 6;
    }
  }
  return 0;
}